

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O3

int main(void)

{
  UTF8Reader UVar1;
  int iVar2;
  LineAndColumn LVar3;
  ostream *poVar4;
  UTF8Reader UVar5;
  long in_FS_OFFSET;
  TokenType type;
  CodeLocation location;
  string inputText;
  SourceFile sourceFile;
  CodeLocation loc;
  SimpleTokeniser tokenizer;
  CompileMessageHandler handler;
  CompileMessageList errors;
  Allocator allocator;
  ifstream input;
  TokenType local_420;
  CodeLocation local_418;
  undefined1 *local_408;
  long local_400;
  undefined1 local_3f8;
  undefined7 uStack_3f7;
  undefined1 local_3e8 [32];
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  string local_3a8;
  CodeLocation local_388;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  local_378;
  _Any_data local_300;
  code *local_2f0;
  code *local_2e8;
  undefined8 local_2e0;
  _Any_data local_2d8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  Allocator local_298;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,"../test/ringtone.soul",_S_in);
  local_400 = 0;
  local_3f8 = 0;
  local_408 = &local_3f8;
  do {
    std::istream::get();
    std::__cxx11::string::push_back((char)&local_408);
  } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
  local_408[local_400 + -1] = 0;
  soul::PoolAllocator::PoolAllocator(&local_298.pool);
  local_298.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.stringDictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002ca250;
  local_298.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.stringDictionary.nextIndex = 1;
  soul::AST::createRootNamespace(&local_298);
  local_3e8._0_8_ = local_3e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"ringtone.soul","");
  local_3c8._M_p = (pointer)&local_3b8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3c8,local_408,local_408 + local_400);
  soul::CodeLocation::createFromSourceFile(&local_418,(SourceFile *)local_3e8);
  local_300._M_unused._M_object = &local_2d8;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8._M_unused._M_object = (void *)0x0;
  local_2d8._8_8_ = 0;
  local_2a8 = 0;
  local_2e8 = std::
              _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
              ::_M_invoke;
  local_300._8_8_ = 0;
  local_2f0 = std::
              _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
              ::_M_manager;
  local_2e0 = *(undefined8 *)(in_FS_OFFSET + -8);
  *(_Any_data **)(in_FS_OFFSET + -8) = &local_300;
  soul::SimpleTokeniser::SimpleTokeniser((SimpleTokeniser *)&local_378,&local_418,true);
  soul::CodeLocation::getOffset(&local_388,(uint32_t)&local_418,0x19);
  local_420.text = (char *)0x0;
  UVar5.data = local_378.startLocation.location.data;
  do {
    if (local_378.currentType.text == "$eof") {
LAB_001b8fa8:
      soul::RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_388.sourceCode.object);
      soul::
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&local_378);
      soul::CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&local_300);
      soul::CompileMessageList::~CompileMessageList((CompileMessageList *)&local_2d8);
      soul::RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_418.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_p != &local_3b8) {
        operator_delete(local_3c8._M_p,local_3b8._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      local_298.stringDictionary.super_StringDictionary._vptr_StringDictionary =
           (_func_int **)&PTR__StringDictionary_002ca250;
      std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
      ~vector(&local_298.stringDictionary.strings);
      std::
      vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_298.identifiers.strings);
      std::
      vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
      ::~vector((vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
                 *)&local_298);
      if (local_408 != &local_3f8) {
        operator_delete(local_408,CONCAT71(uStack_3f7,local_3f8) + 1);
      }
      std::ifstream::~ifstream(local_238);
      return 0;
    }
    if (local_378.currentType.text != (char *)0x0) {
      iVar2 = strcmp(local_378.currentType.text,"$eof");
      if (iVar2 == 0) goto LAB_001b8fa8;
    }
    LVar3 = soul::CodeLocation::getLineAndColumn(&local_378.location);
    UVar1.data = local_378.location.location.data;
    if ((ulong)LVar3 >> 0x23 != 0 && 10 < LVar3.line) {
      soul::TokenType::getDescription_abi_cxx11_(&local_3a8,&local_420);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_3a8._M_dataplus._M_p,
                          local_3a8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,UVar5.data,
                          (long)local_378.location.location.data - (long)UVar5.data);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      goto LAB_001b8fa8;
    }
    local_420.text = local_378.currentType.text;
    soul::
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&local_378);
    UVar5.data = UVar1.data;
  } while( true );
}

Assistant:

int main()
{
    std::ifstream input("../test/ringtone.soul", std::ios::in);
    std::string inputText;
    do
    {
        inputText += input.get();
    } while (!input.eof());
    inputText[inputText.size() - 1] = 0;

    soul::AST::Allocator allocator;
    soul::pool_ptr<soul::AST::Namespace> topLevelNamespace = soul::AST::createRootNamespace(allocator);
    auto sourceFile = soul::SourceFile{"ringtone.soul", inputText};
    soul::CodeLocation location = soul::CodeLocation::createFromSourceFile(sourceFile);

    CompileMessageList errors;
    CompileMessageHandler handler(errors);
    soul::messageHandler = &handler;
    try
    {
        // auto ast = soul::Compiler::parseTopLevelDeclarations(allocator, location, *topLevelNamespace);

        // struct Visitor : public ASTVisitor
        // {
        // public:
        //     void visitObject(AST::ModuleBase &base)
        //     {
        //         ASTVisitor::visitObject(base);
        //     }
        //     void visit(AST::Block &b)
        //     {
        //         ASTVisitor::visit(b);
        //         auto range = SourceCodeUtilities::iterateSyntaxTokens(b);
        //         auto start = range.start.getLineAndColumn();
        //         auto end = range.end.getLineAndColumn();
        //         std::cout << start.line << " " << start.column << std::endl;
        //         std::cout << end.line << " " << end.column << std::endl;
        //     }

        //     std::vector<Definition> definitions;
        //     std::vector<Definition> references;
        //     pool_ptr<CodeLocation> location;
        // };

        // Visitor test;
        // test.location = location;
        // test.visitObject(ast[0].get());

        SimpleTokeniser tokenizer(location, true);
        auto loc = location.getOffset(25, 20);
        auto lastPos = tokenizer.startLocation.location;
        std::string_view last;
        TokenType type;

        while (!tokenizer.matches(Token::eof))
        {
            auto start = tokenizer.location.getLineAndColumn();
            if (start.line >= 11 && start.column > 7)
            {
                std::cout << type.getDescription() << std::endl;
                std::string_view str(
                    lastPos.getAddress(), tokenizer.location.location.getAddress() - lastPos.getAddress());
                std::cout << str << std::endl;
                break;
            }
            type = tokenizer.currentType;
            lastPos = tokenizer.location.location;
            tokenizer.skip();
        }

        // SourceCodeUtilities::findASTObjectAt(*ast[0].get().getAsBlock(), location.getOffset(25, 20));
        // for (auto fn : ast[0].get().getFunctions())
        // {
        //     // auto obj = SourceCodeUtilities::findASTObjectAt(fn.get(), location.getOffset(25, 20));
        // }

        // for (auto def : test.definitions)
        // {
        //     auto start = def.start.getLineAndColumn();
        //     std::cout << "D" << start.line << ":" << start.column << "-" << start.column + def.name.size() << ":" << def.name << std::endl;
        // }

        // for (auto def : test.references)
        // {
        //     auto start = def.start.getLineAndColumn();
        //     std::cout << "R" << start.line << ":" << start.column << "-" << start.column + def.name.size() << ":" << def.name << std::endl;
        // }

        // if (found != nullptr)
        // {
        // }
        // else
        // {
        //     std::cout << "No results found" << std::endl;
        // }
    }
    catch (AbortCompilationException ex)
    {
        std::cout << errors.toString() << std::endl;
    }
}